

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

void GetMinimumPhaseSpectrum(MinimumPhaseAnalysis *minimum_phase)

{
  double dVar1;
  double dVar2;
  fft_plan p;
  fft_plan p_00;
  int iVar3;
  double *in_stack_ffffffffffffff20;
  double dVar4;
  int local_bc;
  int i_3;
  double tmp;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  int local_68;
  int local_64;
  int i_2;
  int i_1;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  int local_14;
  MinimumPhaseAnalysis *pMStack_10;
  int i;
  MinimumPhaseAnalysis *minimum_phase_local;
  
  local_14 = minimum_phase->fft_size / 2;
  while (local_14 = local_14 + 1, local_14 < minimum_phase->fft_size) {
    minimum_phase->log_spectrum[local_14] =
         minimum_phase->log_spectrum[minimum_phase->fft_size - local_14];
  }
  pMStack_10 = minimum_phase;
  memcpy(&i_2,&minimum_phase->inverse_fft,0x48);
  p._8_8_ = local_50;
  p.n = (undefined4)uStack_58;
  p.sign = uStack_58._4_4_;
  p.c_in = (fft_complex *)uStack_48;
  p.in = (double *)local_40;
  p.c_out = (fft_complex *)uStack_38;
  p.out = (double *)local_30;
  p.input = (double *)uStack_28;
  p.ip = (int *)local_20;
  p.w = in_stack_ffffffffffffff20;
  fft_execute(p);
  (*pMStack_10->cepstrum)[1] = (*pMStack_10->cepstrum)[1] * -1.0;
  for (local_64 = 1; local_64 < pMStack_10->fft_size / 2; local_64 = local_64 + 1) {
    pMStack_10->cepstrum[local_64][0] = pMStack_10->cepstrum[local_64][0] * 2.0;
    pMStack_10->cepstrum[local_64][1] = pMStack_10->cepstrum[local_64][1] * -2.0;
  }
  iVar3 = pMStack_10->fft_size / 2;
  pMStack_10->cepstrum[iVar3][1] = pMStack_10->cepstrum[iVar3][1] * -1.0;
  local_68 = pMStack_10->fft_size / 2;
  while (local_68 = local_68 + 1, local_68 < pMStack_10->fft_size) {
    pMStack_10->cepstrum[local_68][0] = 0.0;
    pMStack_10->cepstrum[local_68][1] = 0.0;
  }
  memcpy(&tmp,&pMStack_10->forward_fft,0x48);
  p_00._8_8_ = local_a0;
  p_00.n = (undefined4)uStack_a8;
  p_00.sign = uStack_a8._4_4_;
  p_00.c_in = (fft_complex *)uStack_98;
  p_00.in = (double *)local_90;
  p_00.c_out = (fft_complex *)uStack_88;
  p_00.out = (double *)local_80;
  p_00.input = (double *)uStack_78;
  p_00.ip = (int *)local_70;
  p_00.w = in_stack_ffffffffffffff20;
  fft_execute(p_00);
  for (local_bc = 0; local_bc <= pMStack_10->fft_size / 2; local_bc = local_bc + 1) {
    dVar1 = exp(pMStack_10->minimum_phase_spectrum[local_bc][0] / (double)pMStack_10->fft_size);
    dVar4 = dVar1;
    dVar2 = cos(pMStack_10->minimum_phase_spectrum[local_bc][1] / (double)pMStack_10->fft_size);
    pMStack_10->minimum_phase_spectrum[local_bc][0] = dVar4 * dVar2;
    dVar2 = sin(pMStack_10->minimum_phase_spectrum[local_bc][1] / (double)pMStack_10->fft_size);
    pMStack_10->minimum_phase_spectrum[local_bc][1] = dVar1 * dVar2;
  }
  return;
}

Assistant:

void GetMinimumPhaseSpectrum(const MinimumPhaseAnalysis *minimum_phase) {
  // Mirroring
  for (int i = minimum_phase->fft_size / 2 + 1;
      i < minimum_phase->fft_size; ++i)
    minimum_phase->log_spectrum[i] =
    minimum_phase->log_spectrum[minimum_phase->fft_size - i];

  // This fft_plan carries out "forward" FFT.
  // To carriy out the Inverse FFT, the sign of imaginary part
  // is inverted after FFT.
  fft_execute(minimum_phase->inverse_fft);
  minimum_phase->cepstrum[0][1] *= -1.0;
  for (int i = 1; i < minimum_phase->fft_size / 2; ++i) {
    minimum_phase->cepstrum[i][0] *= 2.0;
    minimum_phase->cepstrum[i][1] *= -2.0;
  }
  minimum_phase->cepstrum[minimum_phase->fft_size / 2][1] *= -1.0;
  for (int i = minimum_phase->fft_size / 2 + 1;
      i < minimum_phase->fft_size; ++i) {
    minimum_phase->cepstrum[i][0] = 0.0;
    minimum_phase->cepstrum[i][1] = 0.0;
  }

  fft_execute(minimum_phase->forward_fft);

  // Since x is complex number, calculation of exp(x) is as following.
  // Note: This FFT library does not keep the aliasing.
  double tmp;
  for (int i = 0; i <= minimum_phase->fft_size / 2; ++i) {
    tmp = exp(minimum_phase->minimum_phase_spectrum[i][0] /
      minimum_phase->fft_size);
    minimum_phase->minimum_phase_spectrum[i][0] = tmp *
      cos(minimum_phase->minimum_phase_spectrum[i][1] /
      minimum_phase->fft_size);
    minimum_phase->minimum_phase_spectrum[i][1] = tmp *
      sin(minimum_phase->minimum_phase_spectrum[i][1] /
      minimum_phase->fft_size);
  }
}